

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::IsInstrInvalidForMemOp(GlobOpt *this,Instr *instr,Loop *loop,Value *src1Val,Value *src2Val)

{
  BasicBlock *pBVar1;
  IRKind IVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  BasicBlock *pBVar6;
  BranchInstr *this_00;
  JITTimeFunctionBody *pJVar7;
  char16 *pcVar8;
  char16 *pcVar9;
  bool local_1d1;
  Instr *__instr___3;
  char16 debugStringBuffer_3 [42];
  Instr *__instr___2;
  char16 debugStringBuffer_2 [42];
  Instr *__instr___1;
  char16 debugStringBuffer_1 [42];
  Instr *__instr__;
  char16 debugStringBuffer [42];
  Value *src2Val_local;
  Value *src1Val_local;
  Loop *loop_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  pBVar1 = this->currentBlock;
  unique0x10000a49 = src2Val;
  pBVar6 = Loop::GetHeadBlock(loop);
  if (pBVar1 != pBVar6) {
    IVar2 = IR::Instr::GetKind(instr);
    local_1d1 = true;
    if (IVar2 != InstrKindLabel) {
      local_1d1 = IR::Instr::IsProfiledLabelInstr(instr);
    }
    if (((((local_1d1 == false) && (bVar3 = IR::Instr::IsRealInstr(instr), bVar3)) &&
         (instr->m_opcode != IncrLoopBodyCount)) &&
        ((instr->m_opcode != StLoopBodyCount && (instr->m_opcode != Ld_A)))) &&
       (instr->m_opcode != Ld_I4)) {
      bVar3 = IR::Instr::IsBranchInstr(instr);
      if (bVar3) {
        this_00 = IR::Instr::AsBranchInstr(instr);
        bVar3 = IR::BranchInstr::IsUnconditional(this_00);
        if (bVar3) goto LAB_005839e1;
      }
      if ((DAT_01ec73ca & 1) != 0) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar5 = Func::GetLocalFunctionId(this->func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
        if (!bVar3) {
          uVar4 = Func::GetSourceContextId(this->func);
          uVar5 = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar4,uVar5);
          if (!bVar3) {
            uVar4 = Func::GetSourceContextId(this->func);
            uVar5 = Func::GetLocalFunctionId(this->func);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar5);
            if (!bVar3) {
              return true;
            }
          }
        }
        Output::Print(L"TRACE MemOp:");
        pJVar7 = Func::GetJITFunctionBody(this->func);
        pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
        pcVar9 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr__);
        uVar4 = Loop::GetLoopNumber(loop);
        Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar8,pcVar9,(ulong)uVar4);
        Output::Print(L"Instruction not accepted for memop");
        unique0x10000a41 = instr;
        if (instr != (Instr *)0x0) {
          IR::Instr::DumpByteCodeOffset(instr);
        }
        if (stack0xffffffffffffff60 != (Instr *)0x0) {
          pcVar8 = Js::OpCodeUtil::GetOpCodeName(stack0xffffffffffffff60->m_opcode);
          Output::Print(L" (%s)",pcVar8);
        }
        Output::Print(L"\n");
        Output::Flush();
      }
      return true;
    }
  }
LAB_005839e1:
  bVar3 = OpCodeAttr::FastFldInstr(instr->m_opcode);
  if ((!bVar3) &&
     ((instr->m_prev == (Instr *)0x0 ||
      (bVar3 = OpCodeAttr::FastFldInstr(instr->m_prev->m_opcode), !bVar3)))) {
    debugStringBuffer_2._76_4_ = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
    bVar3 = Js::OpLayoutType::operator==((OpLayoutType *)(debugStringBuffer_2 + 0x26),ElementSlot);
    if (!bVar3) {
      bVar3 = MayNeedBailOnImplicitCall(instr,src1Val,stack0xffffffffffffffc0);
      if (!bVar3) {
        return false;
      }
      if ((DAT_01ec73ca & 1) != 0) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar5 = Func::GetLocalFunctionId(this->func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
        if (!bVar3) {
          uVar4 = Func::GetSourceContextId(this->func);
          uVar5 = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar4,uVar5);
          if (!bVar3) {
            uVar4 = Func::GetSourceContextId(this->func);
            uVar5 = Func::GetLocalFunctionId(this->func);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar5);
            if (!bVar3) {
              return true;
            }
          }
        }
        Output::Print(L"TRACE MemOp:");
        pJVar7 = Func::GetJITFunctionBody(this->func);
        pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
        pcVar9 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___3);
        uVar4 = Loop::GetLoopNumber(loop);
        Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar8,pcVar9,(ulong)uVar4);
        Output::Print(L"Implicit call bailout detected");
        if (instr != (Instr *)0x0) {
          IR::Instr::DumpByteCodeOffset(instr);
          pcVar8 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
          Output::Print(L" (%s)",pcVar8);
        }
        Output::Print(L"\n");
        Output::Flush();
      }
      return true;
    }
    if ((DAT_01ec73ca & 1) != 0) {
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
      if (!bVar3) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar5 = Func::GetLocalFunctionId(this->func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar4,uVar5);
        if (!bVar3) {
          uVar4 = Func::GetSourceContextId(this->func);
          uVar5 = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar5);
          if (!bVar3) {
            return true;
          }
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar7 = Func::GetJITFunctionBody(this->func);
      pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
      pcVar9 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___2);
      uVar4 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar8,pcVar9,(ulong)uVar4);
      Output::Print(L"Slot interaction detected");
      unique0x10000a21 = instr;
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
      }
      if (stack0xfffffffffffffea0 != (Instr *)0x0) {
        pcVar8 = Js::OpCodeUtil::GetOpCodeName(stack0xfffffffffffffea0->m_opcode);
        Output::Print(L" (%s)",pcVar8);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
    return true;
  }
  if ((DAT_01ec73ca & 1) != 0) {
    uVar4 = Func::GetSourceContextId(this->func);
    uVar5 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
    if (!bVar3) {
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar4,uVar5);
      if (!bVar3) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar5 = Func::GetLocalFunctionId(this->func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar5);
        if (!bVar3) {
          return true;
        }
      }
    }
    Output::Print(L"TRACE MemOp:");
    pJVar7 = Func::GetJITFunctionBody(this->func);
    pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
    pcVar9 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___1);
    uVar4 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar8,pcVar9,(ulong)uVar4);
    Output::Print(L"Field interaction detected");
    unique0x10000a31 = instr;
    if (instr != (Instr *)0x0) {
      IR::Instr::DumpByteCodeOffset(instr);
    }
    if (stack0xffffffffffffff00 != (Instr *)0x0) {
      pcVar8 = Js::OpCodeUtil::GetOpCodeName(stack0xffffffffffffff00->m_opcode);
      Output::Print(L" (%s)",pcVar8);
    }
    Output::Print(L"\n");
    Output::Flush();
  }
  return true;
}

Assistant:

bool
GlobOpt::IsInstrInvalidForMemOp(IR::Instr *instr, Loop *loop, Value *src1Val, Value *src2Val)
{
    // List of instruction that are valid with memop (ie: instr that gets removed if memop is emitted)
    if (
        this->currentBlock != loop->GetHeadBlock() &&
        !instr->IsLabelInstr() &&
        instr->IsRealInstr() &&
        instr->m_opcode != Js::OpCode::IncrLoopBodyCount &&
        instr->m_opcode != Js::OpCode::StLoopBodyCount &&
        instr->m_opcode != Js::OpCode::Ld_A &&
        instr->m_opcode != Js::OpCode::Ld_I4 &&
        !(instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional())
    )
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Instruction not accepted for memop"));
        return true;
    }

    // Check prev instr because it could have been added by an optimization and we won't see it here.
    if (OpCodeAttr::FastFldInstr(instr->m_opcode) || (instr->m_prev && OpCodeAttr::FastFldInstr(instr->m_prev->m_opcode)))
    {
        // Refuse any operations interacting with Fields
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Field interaction detected"));
        return true;
    }

    if (Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::ElementSlot)
    {
        // Refuse any operations interacting with slots
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Slot interaction detected"));
        return true;
    }

    if (this->MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("Implicit call bailout detected"));
        return true;
    }

    return false;
}